

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::
     OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::operate(View<float,_false,_std::allocator<unsigned_long>_> *v,
              View<float,_true,_std::allocator<unsigned_long>_> *w,float *param_3,size_t param_4)

{
  size_t sVar1;
  ulong local_38;
  size_t j;
  float *data2_local;
  float *data1_local;
  View<float,_true,_std::allocator<unsigned_long>_> *w_local;
  View<float,_false,_std::allocator<unsigned_long>_> *v_local;
  
  local_38 = 0;
  j = param_4;
  data2_local = param_3;
  while( true ) {
    sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,9);
    if (sVar1 <= local_38) break;
    OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,data2_local,j);
    sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,9);
    data2_local = data2_local + sVar1;
    sVar1 = View<float,_true,_std::allocator<unsigned_long>_>::strides(w,9);
    j = sVar1 * 4 + j;
    local_38 = local_38 + 1;
  }
  View<float,_false,_std::allocator<unsigned_long>_>::shape(v,9);
  View<float,_false,_std::allocator<unsigned_long>_>::strides(v,9);
  View<float,_true,_std::allocator<unsigned_long>_>::shape(w,9);
  View<float,_true,_std::allocator<unsigned_long>_>::strides(w,9);
  return;
}

Assistant:

static inline void operate
    (
        View<T1, false, A1>& v, 
        const View<T2, isConst, A2>& w, 
        Functor f, 
        T1* data1,
        const T2* data2
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperBinary<N-1, Functor, T1, T2, isConst, A1, A2>::operate(
                v, w, f, data1, data2);
            data1 += v.strides(N-1);
            data2 += w.strides(N-1);
        }
        data1 -= v.shape(N-1) * v.strides(N-1);
        data2 -= w.shape(N-1) * w.strides(N-1);
    }